

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

void __thiscall ncnn::Net::clear(Net *this)

{
  uint uVar1;
  Layer *pLVar2;
  pointer poVar3;
  pointer pcVar4;
  layer_destroyer_func p_Var5;
  code *pcVar6;
  int iVar7;
  NetPrivate *pNVar8;
  pointer ppLVar9;
  long lVar10;
  pointer ppLVar11;
  long lVar12;
  long lVar13;
  pointer poVar14;
  ulong uVar15;
  Option opt1;
  Option local_70;
  
  std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::_M_erase_at_end
            (&this->d->blobs,
             (this->d->blobs).super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
             super__Vector_impl_data._M_start);
  pNVar8 = this->d;
  ppLVar9 = (pNVar8->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppLVar11 = (pNVar8->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (ppLVar11 != ppLVar9) {
    uVar15 = 0;
    do {
      pLVar2 = ppLVar9[uVar15];
      get_masked_option(&local_70,&this->opt,pLVar2->featmask);
      iVar7 = (*pLVar2->_vptr_Layer[5])();
      if (iVar7 != 0) {
        clear();
      }
      uVar1 = pLVar2->typeindex;
      if ((uVar1 >> 8 & 1) == 0) {
        poVar3 = (this->d->overwrite_builtin_layer_registry).
                 super__Vector_base<ncnn::overwrite_builtin_layer_registry_entry,_std::allocator<ncnn::overwrite_builtin_layer_registry_entry>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar10 = (long)(this->d->overwrite_builtin_layer_registry).
                       super__Vector_base<ncnn::overwrite_builtin_layer_registry_entry,_std::allocator<ncnn::overwrite_builtin_layer_registry_entry>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)poVar3;
        if (lVar10 != 0) {
          lVar10 = lVar10 >> 5;
          lVar12 = 0;
          lVar13 = 0;
          poVar14 = poVar3;
          do {
            if (poVar14->typeindex == uVar1) {
              if ((int)lVar13 != -1) {
                pcVar6 = *(code **)((long)&poVar3->destroyer + (lVar12 >> 0x1b));
                if (pcVar6 != (code *)0x0) {
                  (*pcVar6)(pLVar2,*(undefined8 *)((long)&poVar3->userdata + (lVar12 >> 0x1b)));
                  goto LAB_0016ceb6;
                }
              }
              break;
            }
            lVar13 = lVar13 + 1;
            lVar12 = lVar12 + 0x100000000;
            poVar14 = poVar14 + 1;
          } while (lVar10 + (ulong)(lVar10 == 0) != lVar13);
        }
LAB_0016ceac:
        (*pLVar2->_vptr_Layer[1])(pLVar2);
      }
      else {
        pcVar4 = (this->d->custom_layer_registry).
                 super__Vector_base<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        p_Var5 = pcVar4[(long)(int)uVar1 & 0x7fffffffffffeffU].destroyer;
        if (p_Var5 == (layer_destroyer_func)0x0) goto LAB_0016ceac;
        (*p_Var5)(pLVar2,pcVar4[(long)(int)uVar1 & 0x7fffffffffffeffU].userdata);
      }
LAB_0016ceb6:
      uVar15 = uVar15 + 1;
      pNVar8 = this->d;
      ppLVar9 = (pNVar8->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ppLVar11 = (pNVar8->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
    } while (uVar15 < (ulong)((long)ppLVar11 - (long)ppLVar9 >> 3));
  }
  if (ppLVar11 != ppLVar9) {
    (pNVar8->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppLVar9;
  }
  if (pNVar8->local_blob_allocator != (PoolAllocator *)0x0) {
    (*(pNVar8->local_blob_allocator->super_Allocator)._vptr_Allocator[1])();
    pNVar8 = this->d;
    pNVar8->local_blob_allocator = (PoolAllocator *)0x0;
  }
  if (pNVar8->local_workspace_allocator != (PoolAllocator *)0x0) {
    (*(pNVar8->local_workspace_allocator->super_Allocator)._vptr_Allocator[1])();
    this->d->local_workspace_allocator = (PoolAllocator *)0x0;
  }
  return;
}

Assistant:

void Net::clear()
{
    d->blobs.clear();
    for (size_t i = 0; i < d->layers.size(); i++)
    {
        Layer* layer = d->layers[i];

        Option opt1 = get_masked_option(opt, layer->featmask);
#if NCNN_VULKAN
        if (!layer->support_image_storage)
        {
            opt1.use_image_storage = false;
        }
#endif // NCNN_VULKAN

        int dret = layer->destroy_pipeline(opt1);
        if (dret != 0)
        {
            NCNN_LOGE("layer destroy_pipeline failed");
            // ignore anyway
        }

        if (layer->typeindex & ncnn::LayerType::CustomBit)
        {
            int custom_index = layer->typeindex & ~ncnn::LayerType::CustomBit;
            if (d->custom_layer_registry[custom_index].destroyer)
            {
                d->custom_layer_registry[custom_index].destroyer(layer, d->custom_layer_registry[custom_index].userdata);
            }
            else
            {
                delete layer;
            }
        }
        else
        {
            // check overwrite builtin layer destroyer
            int index = -1;
            const size_t overwrite_builtin_layer_registry_entry_count = d->overwrite_builtin_layer_registry.size();
            for (size_t i = 0; i < overwrite_builtin_layer_registry_entry_count; i++)
            {
                if (d->overwrite_builtin_layer_registry[i].typeindex == layer->typeindex)
                {
                    index = i;
                    break;
                }
            }

            if (index != -1 && d->overwrite_builtin_layer_registry[index].destroyer)
            {
                d->overwrite_builtin_layer_registry[index].destroyer(layer, d->overwrite_builtin_layer_registry[index].userdata);
            }
            else
            {
                delete layer;
            }
        }
    }
    d->layers.clear();

    if (d->local_blob_allocator)
    {
        delete d->local_blob_allocator;
        d->local_blob_allocator = 0;
    }
    if (d->local_workspace_allocator)
    {
        delete d->local_workspace_allocator;
        d->local_workspace_allocator = 0;
    }

#if NCNN_VULKAN
    if (d->weight_vkallocator)
    {
        delete d->weight_vkallocator;
        d->weight_vkallocator = 0;
    }
    if (d->weight_staging_vkallocator)
    {
        delete d->weight_staging_vkallocator;
        d->weight_staging_vkallocator = 0;
    }
    if (d->pipeline_cache)
    {
        delete d->pipeline_cache;
        d->pipeline_cache = 0;
        opt.pipeline_cache = 0;
    }
#endif // NCNN_VULKAN
}